

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf_crypt_fuzzer.cc
# Opt level: O0

shared_ptr<QPDF> __thiscall FuzzHelper::getQpdf(FuzzHelper *this)

{
  BufferInputSource *this_00;
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Buffer *in_RSI;
  shared_ptr<QPDF> sVar2;
  shared_ptr<InputSource> local_70;
  undefined1 local_5e;
  undefined1 local_5d;
  allocator<char> local_49;
  string local_48;
  undefined1 local_28 [8];
  shared_ptr<InputSource> is;
  FuzzHelper *this_local;
  shared_ptr<QPDF> *qpdf;
  
  this_00 = (BufferInputSource *)operator_new(0xe8);
  local_5d = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"fuzz input",&local_49);
  BufferInputSource::BufferInputSource(this_00,&local_48,in_RSI,false);
  local_5d = 0;
  std::shared_ptr<InputSource>::shared_ptr<BufferInputSource,void>
            ((shared_ptr<InputSource> *)local_28,this_00);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  local_5e = 0;
  QPDF::create();
  peVar1 = std::__shared_ptr_access<QPDF,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<QPDF,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)this);
  QPDF::setMaxWarnings(peVar1,200);
  peVar1 = std::__shared_ptr_access<QPDF,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<QPDF,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)this);
  std::shared_ptr<InputSource>::shared_ptr(&local_70,(shared_ptr<InputSource> *)local_28);
  QPDF::processInputSource(peVar1,&local_70,(char *)0x0);
  std::shared_ptr<InputSource>::~shared_ptr(&local_70);
  local_5e = 1;
  std::shared_ptr<InputSource>::~shared_ptr((shared_ptr<InputSource> *)local_28);
  sVar2.super___shared_ptr<QPDF,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = extraout_RDX._M_pi;
  sVar2.super___shared_ptr<QPDF,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<QPDF>)sVar2.super___shared_ptr<QPDF,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<QPDF>
FuzzHelper::getQpdf()
{
    auto is =
        std::shared_ptr<InputSource>(new BufferInputSource("fuzz input", &this->input_buffer));
    auto qpdf = QPDF::create();
    qpdf->setMaxWarnings(200);
    qpdf->processInputSource(is);
    return qpdf;
}